

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::SocketWriter::Send(SocketWriter *this,string *message)

{
  int __fd;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *__buf;
  ssize_t sVar4;
  long in_FS_OFFSET;
  int len;
  string *message_local;
  SocketWriter *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsTrue(this->sockfd_ != -1);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)((long)&this_local + 4),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x42d);
    poVar3 = GTestLog::GetStream((GTestLog *)((long)&this_local + 4));
    poVar3 = std::operator<<(poVar3,"Condition sockfd_ != -1 failed. ");
    std::operator<<(poVar3,"Send() can be called only when there is a connection.");
    GTestLog::~GTestLog((GTestLog *)((long)&this_local + 4));
  }
  iVar2 = std::__cxx11::string::length();
  __fd = this->sockfd_;
  __buf = (void *)std::__cxx11::string::c_str();
  sVar4 = write(__fd,__buf,(long)iVar2);
  if (sVar4 != iVar2) {
    GTestLog::GTestLog((GTestLog *)&this_local,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x432);
    poVar3 = GTestLog::GetStream((GTestLog *)&this_local);
    poVar3 = std::operator<<(poVar3,"stream_result_to: failed to stream to ");
    poVar3 = std::operator<<(poVar3,(string *)&this->host_name_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&this->port_num_);
    GTestLog::~GTestLog((GTestLog *)&this_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

virtual void Send(const std::string& message) {
      GTEST_CHECK_(sockfd_ != -1)
          << "Send() can be called only when there is a connection.";

      const int len = static_cast<int>(message.length());
      if (write(sockfd_, message.c_str(), len) != len) {
        GTEST_LOG_(WARNING)
            << "stream_result_to: failed to stream to "
            << host_name_ << ":" << port_num_;
      }
    }